

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O2

string * gmlc::networking::getLocalExternalAddressV4_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  long lVar3;
  pointer pbVar4;
  pointer pbVar5;
  __type_conflict _Var6;
  size_type sVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type *this;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  long *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  size_type local_138;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  error_code ec;
  query query;
  resolver resolver;
  
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  query.hints_._0_8_ = &query.hints_.ai_addrlen;
  query.hints_.ai_socktype = 0;
  query.hints_.ai_protocol = 0;
  query.hints_.ai_addrlen._0_1_ = 0;
  AsioContextManager::getContextPointer((AsioContextManager *)&srv,(string *)&query);
  std::__cxx11::string::~string((string *)&query);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (&resolver,
             ((srv.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,0);
  local_148 = (long *)CONCAT44(local_148._4_4_,2);
  asio::ip::host_name_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&interface_addresses,"",(allocator<char> *)&ec);
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&query,(protocol_type *)&local_148,&local_188,(string *)&interface_addresses,
             address_configured);
  std::__cxx11::string::~string((string *)&interface_addresses);
  std::__cxx11::string::~string((string *)&local_188);
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)&local_188,&resolver,&query,&ec);
  local_138 = local_188.field_2._M_allocated_capacity;
  _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length;
  this = &local_188._M_string_length;
  local_188._M_string_length = 0;
  local_188.field_2._M_allocated_capacity = 0;
  local_148 = (long *)local_188._M_dataplus._M_p;
  local_188._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this);
  if (ec._M_value == 0) {
    lVar3 = *local_148;
    lVar8 = local_138 * 0x60;
    interface_addresses.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = *(undefined4 *)(lVar3 + 4 + lVar8);
    puVar2 = (undefined8 *)(lVar3 + 8 + lVar8);
    interface_addresses.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar2;
    interface_addresses.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar2[1];
    bVar11 = *(short *)(lVar3 + lVar8) != 2;
    if (bVar11) {
      interface_addresses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    }
    else {
      interface_addresses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      interface_addresses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    interface_addresses.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)bVar11;
    asio::ip::address::to_string_abi_cxx11_(&local_188,(address *)&interface_addresses);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_1a8,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
  }
  netif::getInterfaceAddressesV4_abi_cxx11_();
  pbVar4 = interface_addresses.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(interface_addresses.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     (uint)interface_addresses.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  if (pbVar10 ==
      interface_addresses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (local_1a8._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)in_RDI,"0.0.0.0",(allocator<char> *)&local_188);
      goto LAB_00378c94;
    }
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) {
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_1a8.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_1a8._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
    }
    in_RDI->_M_string_length = local_1a8._M_string_length;
  }
  else {
    do {
      pbVar5 = interface_addresses.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar10 == pbVar4) {
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        local_188._M_string_length = 0;
        local_188.field_2._M_allocated_capacity =
             local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(interface_addresses.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (uint)interface_addresses.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        goto LAB_00378b64;
      }
      _Var6 = std::operator==(pbVar10,&local_1a8);
      pbVar10 = pbVar10 + 1;
    } while (!_Var6);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) {
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_1a8.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_1a8._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
    }
    in_RDI->_M_string_length = local_1a8._M_string_length;
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  goto LAB_00378c94;
LAB_00378b64:
  if (pbVar10 == pbVar5) goto LAB_00378bbf;
  std::__cxx11::string::string((string *)in_RDI,pbVar10);
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (in_RDI,"127.",0);
  if (sVar7 != 0) {
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                      (in_RDI,"169.254.",0);
    if (sVar7 != 0) goto LAB_00378c85;
    if (local_188._M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_188,in_RDI);
    }
  }
  std::__cxx11::string::~string((string *)in_RDI);
  pbVar10 = pbVar10 + 1;
  goto LAB_00378b64;
LAB_00378bbf:
  paVar1 = &in_RDI->field_2;
  (in_RDI->_M_dataplus)._M_p = (pointer)paVar1;
  if (local_188._M_string_length == 0) {
    paVar9 = &local_1a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == paVar9) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_1a8.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_1a8._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
    }
    this = &local_1a8._M_string_length;
    in_RDI->_M_string_length = local_1a8._M_string_length;
    local_1a8._M_dataplus._M_p = (pointer)paVar9;
  }
  else {
    paVar9 = &local_188.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p == paVar9) {
      paVar1->_M_allocated_capacity = local_188.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_188.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_188._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
    }
    in_RDI->_M_string_length = local_188._M_string_length;
    local_188._M_dataplus._M_p = (pointer)paVar9;
  }
  *this = 0;
  paVar9->_M_local_buf[0] = '\0';
LAB_00378c85:
  std::__cxx11::string::~string((string *)&local_188);
LAB_00378c94:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&interface_addresses);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_140);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&query);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&resolver.impl_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&srv.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_1a8);
  return in_RDI;
}

Assistant:

std::string getLocalExternalAddressV4()
{
    std::string resolved_address;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v4(), asio::ip::host_name(), "");
    std::error_code ec;
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);

    if (!ec) {
        asio::ip::tcp::endpoint endpoint = *it;
        resolved_address = endpoint.address().to_string();
    }
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV4();

    // Return the resolved address if no interface addresses were found
    if (interface_addresses.empty()) {
        if (resolved_address.empty()) {
            return "0.0.0.0";
        }
        return resolved_address;
    }

    // Use the resolved address if it matches one of the interface addresses
    for (const auto& addr : interface_addresses) {
        if (addr == resolved_address) {
            return resolved_address;
        }
    }

    // Pick an interface that isn't an IPv4 loopback address, 127.0.0.1/8
    // or an IPv4 link-local address, 169.254.0.0/16
    std::string link_local_addr;
    for (auto addr : interface_addresses) {
        if (addr.rfind("127.", 0) != 0) {
            if (addr.rfind("169.254.", 0) != 0) {
                return addr;
            }
            if (link_local_addr.empty()) {
                link_local_addr = addr;
            }
        }
    }

    // Return a link-local address since no alternatives were found
    if (!link_local_addr.empty()) {
        return link_local_addr;
    }

    // Very likely that any address returned at this point won't be a working
    // external address
    return resolved_address;
}